

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_fuseequal(ASMState *as,IRIns *ir)

{
  ushort *in_RSI;
  long in_RDI;
  IROp in_stack_0000004c;
  IRIns *in_stack_00000050;
  ASMState *in_stack_00000058;
  IRIns *in_stack_00000068;
  ASMState *in_stack_00000070;
  
  if ((*(char *)((long)in_RSI + -3) == ':') && ((uint)*in_RSI == *(int *)(in_RDI + 200) - 1U)) {
    *(int *)(in_RDI + 200) = *(int *)(in_RDI + 200) + -1;
    asm_href(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  }
  else {
    asm_comp(in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

static void asm_fuseequal(ASMState *as, IRIns *ir)
{
  /* Fuse HREF + EQ/NE. */
  if ((ir-1)->o == IR_HREF && ir->op1 == as->curins-1) {
    as->curins--;
    asm_href(as, ir-1, (IROp)ir->o);
  } else {
    asm_equal(as, ir);
  }
}